

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  uint len;
  uint uVar8;
  int l;
  xmlChar buf [105];
  int local_b8;
  int local_b4;
  ulong local_b0;
  xmlChar local_a8 [120];
  
  iVar7 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar7 = 50000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate != XML_PARSER_EOF) {
    local_b4 = iVar7;
    iVar2 = xmlCurrentChar(ctxt,&local_b8);
    iVar7 = 0;
    len = 0;
    do {
      iVar3 = xmlIsNameChar(ctxt,iVar2);
      if (iVar3 == 0) {
        if (len == 0) {
          return (xmlChar *)0x0;
        }
        pxVar5 = xmlStrndup(local_a8,len);
        return pxVar5;
      }
      if (iVar7 < 0x65) {
        iVar7 = iVar7 + 1;
      }
      else {
        iVar7 = 0;
        if ((ctxt->progressive == 0) &&
           (iVar7 = 0, (long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
      }
      if (local_b8 == 1) {
        uVar8 = len + 1;
        local_a8[(int)len] = (xmlChar)iVar2;
      }
      else {
        iVar2 = xmlCopyCharMultiByte(local_a8 + (int)len,iVar2);
        uVar8 = len + iVar2;
      }
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_b8;
      iVar2 = xmlCurrentChar(ctxt,&local_b8);
      if (iVar2 == 0) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        iVar2 = xmlCurrentChar(ctxt,&local_b8);
        iVar7 = 0;
      }
      len = uVar8;
    } while ((int)uVar8 < 100);
    local_b0 = (ulong)(uVar8 * 2);
    pxVar5 = (xmlChar *)(*xmlMallocAtomic)(local_b0);
    iVar3 = local_b4;
    if (pxVar5 == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      memcpy(pxVar5,local_a8,(ulong)uVar8);
      do {
        iVar4 = xmlIsNameChar(ctxt,iVar2);
        if (iVar4 == 0) {
          pxVar5[(int)uVar8] = '\0';
          return pxVar5;
        }
        if (iVar7 < 0x65) {
          iVar7 = iVar7 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar7 = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_001589d9;
        }
        pxVar6 = pxVar5;
        if ((int)local_b0 < (int)(uVar8 + 10)) {
          local_b0 = (ulong)(uint)((int)local_b0 * 2);
          pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,local_b0);
          iVar3 = local_b4;
          if (pxVar6 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar5);
            return (xmlChar *)0x0;
          }
        }
        if (local_b8 == 1) {
          pxVar6[(int)uVar8] = (xmlChar)iVar2;
          uVar8 = uVar8 + 1;
        }
        else {
          iVar2 = xmlCopyCharMultiByte(pxVar6 + (int)uVar8,iVar2);
          uVar8 = iVar2 + uVar8;
        }
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + local_b8;
        iVar2 = xmlCurrentChar(ctxt,&local_b8);
        pxVar5 = pxVar6;
      } while ((int)uVar8 <= iVar3);
      xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NmToken");
LAB_001589d9:
      (*xmlFree)(pxVar5);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;
    int count = 0;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

#ifdef DEBUG
    nbParseNmToken++;
#endif

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);
    c = CUR_CHAR(l);

    while (xmlIsNameChar(ctxt, c)) {
	if (count++ > XML_PARSER_CHUNK_SIZE) {
	    count = 0;
	    GROW;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (c == 0) {
	    count = 0;
	    GROW;
	    if (ctxt->instate == XML_PARSER_EOF)
		return(NULL);
            c = CUR_CHAR(l);
	}
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (count++ > XML_PARSER_CHUNK_SIZE) {
		    count = 0;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buffer);
                        return(NULL);
                    }
		}
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
                if (len > maxLength) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                    xmlFree(buffer);
                    return(NULL);
                }
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    return(xmlStrndup(buf, len));
}